

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPardisoSolver.cpp
# Opt level: O0

void __thiscall TPZPardisoSolver<double>::Decompose(TPZPardisoSolver<double> *this)

{
  TPZMatrix<double> *pTVar1;
  TPZFYsmpMatrix<double> *tmpNSym;
  TPZSYsmpMatrix<double> *tmpSym;
  size_t in_stack_00000398;
  char *in_stack_000003a0;
  TPZMatrixSolver<double> *in_stack_ffffffffffffff78;
  TPZAutoPointer<TPZMatrix<double>_> *in_stack_ffffffffffffff80;
  TPZPardisoSolver<double> *local_78;
  long local_58;
  TPZAutoPointer<TPZMatrix<double>_> local_38;
  TPZPardisoSolver<double> *local_30;
  TPZAutoPointer<TPZMatrix<double>_> local_18;
  long local_10;
  
  TPZMatrixSolver<double>::Matrix(in_stack_ffffffffffffff78);
  pTVar1 = TPZAutoPointer<TPZMatrix<double>_>::operator->(&local_18);
  if (pTVar1 == (TPZMatrix<double> *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = __dynamic_cast(pTVar1,&TPZMatrix<double>::typeinfo,&TPZSYsmpMatrix<double>::typeinfo,
                              0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(in_stack_ffffffffffffff80);
  local_10 = local_58;
  TPZMatrixSolver<double>::Matrix(in_stack_ffffffffffffff78);
  pTVar1 = TPZAutoPointer<TPZMatrix<double>_>::operator->(&local_38);
  if (pTVar1 == (TPZMatrix<double> *)0x0) {
    local_78 = (TPZPardisoSolver<double> *)0x0;
  }
  else {
    local_78 = (TPZPardisoSolver<double> *)
               __dynamic_cast(pTVar1,&TPZMatrix<double>::typeinfo,&TPZFYsmpMatrix<double>::typeinfo,
                              0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)local_78);
  local_30 = local_78;
  if (local_10 == 0) {
    if (local_78 == (TPZPardisoSolver<double> *)0x0) {
      std::operator<<((ostream *)&std::cerr,
                      "virtual void TPZPardisoSolver<double>::Decompose() [TVar = double]");
      std::operator<<((ostream *)&std::cerr,
                      "This solver is only compatible with sparse matrices.\nAborting...\n");
      pzinternal::DebugStopImpl(in_stack_000003a0,in_stack_00000398);
    }
    else {
      Decompose(local_78,(TPZMatrix<double> *)in_stack_ffffffffffffff78);
    }
  }
  else {
    Decompose(local_78,(TPZMatrix<double> *)in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void TPZPardisoSolver<TVar>::Decompose()
{
    auto *tmpSym =
        dynamic_cast<TPZSYsmpMatrix<TVar>*>(this->Matrix().operator->());
    auto *tmpNSym =
        dynamic_cast<TPZFYsmpMatrix<TVar>*>(this->Matrix().operator->());
    if(tmpSym){
        Decompose(tmpSym);
    }else if(tmpNSym){
        Decompose(tmpNSym);
    }else{
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"This solver is only compatible with sparse matrices.\nAborting...\n";
        DebugStop();
    }
}